

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

timestamp_ns_t duckdb::Cast::Operation<duckdb::string_t,duckdb::timestamp_ns_t>(string_t input)

{
  string_t str;
  bool bVar1;
  char *str_00;
  timestamp_t input_00;
  ConversionException *this;
  char *in_RSI;
  ulong in_RDI;
  timestamp_ns_t result;
  int32_t nanos;
  timestamp_ns_t local_58;
  int32_t local_4c [2];
  char acStackY_44 [4];
  _Alloc_hider in_stack_ffffffffffffffc8;
  
  str_00 = acStackY_44;
  if (0xc < (in_RDI & 0xffffffff)) {
    str_00 = in_RSI;
  }
  input_00 = Timestamp::FromCString(str_00,in_RDI & 0xffffffff,(optional_ptr<int,_true>)local_4c);
  bVar1 = Timestamp::TryFromTimestampNanos(input_00,local_4c[0],&local_58);
  if (bVar1) {
    return (timestamp_t)local_58.super_timestamp_t.value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  str.value.pointer.ptr = in_stack_ffffffffffffffc8._M_p;
  str.value._0_8_ = in_RSI;
  Timestamp::RangeError_abi_cxx11_(str);
  ConversionException::ConversionException(this,(string *)&stack0xffffffffffffffc8);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TryCast::Operation(bool input, uint16_t &result, bool strict) {
	return NumericTryCast::Operation<bool, uint16_t>(input, result, strict);
}